

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecodeEVEX(ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,ZyanU8 *data)

{
  byte bVar1;
  ZydisMachineMode ZVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  
  if (*data != 'b') {
    __assert_fail("data[0] == 0x62",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x216,
                  "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  if (instruction->length - 4 != (uint)(instruction->raw).field_3.evex.offset) {
    __assert_fail("instruction->raw.evex.offset == instruction->length - 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x217,
                  "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                 );
  }
  ZVar2 = instruction->machine_mode;
  if (ZVar2 == ZYDIS_MACHINE_MODE_MAX_VALUE) {
    return 0x80200001;
  }
  *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x20;
  (instruction->raw).field_3.rex.W = data[1] >> 7;
  (instruction->raw).field_3.rex.R = data[1] >> 6 & 1;
  (instruction->raw).field_3.rex.X = data[1] >> 5 & 1;
  (instruction->raw).field_3.rex.B = data[1] >> 4 & 1;
  if ((data[1] & 8) == 0) {
    uVar4 = data[1] & 7;
    (instruction->raw).field_3.rex.offset = (ZyanU8)uVar4;
    if ((uVar4 < 8) && ((0x91U >> uVar4 & 1) != 0)) {
      return 0x80200007;
    }
    bVar3 = data[2];
    (instruction->raw).field_3.xop.vvvv = bVar3 >> 7;
    (instruction->raw).field_3.xop.L = data[2] >> 3 & 0xf;
    if ((data[2] & 4) == 0) {
      __assert_fail("((data[2] >> 2) & 0x01) == 0x01",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x238,
                    "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                   );
    }
    (instruction->raw).field_3.xop.pp = data[2] & 3;
    bVar1 = data[3];
    (instruction->raw).field_3.xop.offset = bVar1 >> 7;
    (instruction->raw).field_3.vex.size = data[3] >> 6 & 1;
    (instruction->raw).field_3.evex.L = data[3] >> 5 & 1;
    (instruction->raw).field_3.evex.b = data[3] >> 4 & 1;
    bVar5 = data[3] >> 3 & 1;
    (instruction->raw).field_3.evex.V2 = bVar5;
    if (ZVar2 == ZYDIS_MACHINE_MODE_LONG_64 || bVar5 != 0) {
      bVar5 = data[3];
      (instruction->raw).field_3.evex.aaa = bVar5 & 7;
      if ((char)bVar1 < '\0' && (bVar5 & 7) == 0) {
        return 0x8020000a;
      }
      (context->vector_unified).W = bVar3 >> 7;
      (context->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
      (context->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
      (context->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
      bVar3 = data[3] >> 5 & 3;
      (context->vector_unified).LL = bVar3;
      (context->vector_unified).R2 = ~(instruction->raw).field_3.rex.B & 1;
      (context->vector_unified).V2 = ~(instruction->raw).field_3.evex.V2 & 1;
      (context->vector_unified).vvvv = ~(instruction->raw).field_3.xop.L & 0xf;
      (context->vector_unified).mask = (instruction->raw).field_3.evex.aaa;
      if ((ZVar2 != ZYDIS_MACHINE_MODE_LONG_64) && ((instruction->raw).field_3.evex.V2 == '\0')) {
        return 0x80200008;
      }
      if (bVar3 != 3 || (instruction->raw).field_3.evex.b != '\0') {
        return 0x100000;
      }
      return 0x80200008;
    }
  }
  return 0x80200008;
}

Assistant:

static ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZyanU8 data[4])
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(data[0] == 0x62);
    ZYAN_ASSERT(instruction->raw.evex.offset == instruction->length - 4);

    if (instruction->machine_mode == ZYDIS_MACHINE_MODE_REAL_16)
    {
        // EVEX is invalid in 16-bit real mode
        return ZYDIS_STATUS_DECODING_ERROR;
    }

    instruction->attributes |= ZYDIS_ATTRIB_HAS_EVEX;
    instruction->raw.evex.R         = (data[1] >> 7) & 0x01;
    instruction->raw.evex.X         = (data[1] >> 6) & 0x01;
    instruction->raw.evex.B         = (data[1] >> 5) & 0x01;
    instruction->raw.evex.R2        = (data[1] >> 4) & 0x01;

    if (data[1] & 0x08)
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    instruction->raw.evex.mmm       = (data[1] >> 0) & 0x07;

    if ((instruction->raw.evex.mmm == 0x00) ||
        (instruction->raw.evex.mmm == 0x04) ||
        (instruction->raw.evex.mmm == 0x07))
    {
        // Invalid according to the intel documentation
        return ZYDIS_STATUS_INVALID_MAP;
    }

    instruction->raw.evex.W         = (data[2] >> 7) & 0x01;
    instruction->raw.evex.vvvv      = (data[2] >> 3) & 0x0F;

    ZYAN_ASSERT(((data[2] >> 2) & 0x01) == 0x01);

    instruction->raw.evex.pp        = (data[2] >> 0) & 0x03;
    instruction->raw.evex.z         = (data[3] >> 7) & 0x01;
    instruction->raw.evex.L2        = (data[3] >> 6) & 0x01;
    instruction->raw.evex.L         = (data[3] >> 5) & 0x01;
    instruction->raw.evex.b         = (data[3] >> 4) & 0x01;
    instruction->raw.evex.V2        = (data[3] >> 3) & 0x01;

    if (!instruction->raw.evex.V2 &&
        (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64))
    {
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    instruction->raw.evex.aaa       = (data[3] >> 0) & 0x07;

    if (instruction->raw.evex.z && !instruction->raw.evex.aaa)
    {
        return ZYDIS_STATUS_INVALID_MASK; // TODO: Dedicated status code
    }

    // Update internal fields
    context->vector_unified.W    = instruction->raw.evex.W;
    context->vector_unified.R    = 0x01 & ~instruction->raw.evex.R;
    context->vector_unified.X    = 0x01 & ~instruction->raw.evex.X;
    context->vector_unified.B    = 0x01 & ~instruction->raw.evex.B;
    context->vector_unified.LL   = (data[3] >> 5) & 0x03;
    context->vector_unified.R2   = 0x01 & ~instruction->raw.evex.R2;
    context->vector_unified.V2   = 0x01 & ~instruction->raw.evex.V2;
    context->vector_unified.vvvv = 0x0F & ~instruction->raw.evex.vvvv;
    context->vector_unified.mask = instruction->raw.evex.aaa;

    if (!instruction->raw.evex.V2 && (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64))
    {
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }
    if (!instruction->raw.evex.b && (context->vector_unified.LL == 3))
    {
        // LL = 3 is only valid for instructions with embedded rounding control
        return ZYDIS_STATUS_MALFORMED_EVEX;
    }

    return ZYAN_STATUS_SUCCESS;
}